

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmMakefileTargetGeneratorObjectStrings::MaybeConvertToRelativePath
          (string *__return_storage_ptr__,cmMakefileTargetGeneratorObjectStrings *this,string *obj)

{
  bool bVar1;
  char *pcVar2;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  string *local_20;
  string *obj_local;
  cmMakefileTargetGeneratorObjectStrings *this_local;
  
  local_20 = obj;
  obj_local = (string *)this;
  this_local = (cmMakefileTargetGeneratorObjectStrings *)__return_storage_ptr__;
  pcVar2 = cmStateDirectory::GetCurrentBinary(&this->StateDir);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,pcVar2,&local_41);
  bVar1 = cmOutputConverter::ContainedInDirectory(&local_40,local_20,&this->StateDir);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pcVar2 = cmStateDirectory::GetCurrentBinary(&this->StateDir);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,pcVar2,&local_79);
    cmOutputConverter::ForceToRelativePath(__return_storage_ptr__,&local_78,local_20);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MaybeConvertToRelativePath(std::string const& obj)
  {
    if (!cmOutputConverter::ContainedInDirectory(
          this->StateDir.GetCurrentBinary(), obj, this->StateDir)) {
      return obj;
    }
    return cmOutputConverter::ForceToRelativePath(
      this->StateDir.GetCurrentBinary(), obj);
  }